

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema.c++
# Opt level: O3

InterfaceSchema __thiscall capnp::Schema::asInterface(Schema *this)

{
  DebugExpression<bool> _kjCondition;
  StructReader local_78;
  Fault f;
  ArrayPtr<const_char> local_38;
  WirePointer *local_28;
  int local_20;
  
  local_28 = (WirePointer *)this->raw->generic->encodedNode;
  local_38 = (ArrayPtr<const_char>)ZEXT816(0);
  local_20 = 0x7fffffff;
  capnp::_::PointerReader::getStruct(&local_78,(PointerReader *)&local_38,(word *)0x0);
  if (local_78.dataSize < 0x70) {
    _kjCondition.value = false;
  }
  else {
    _kjCondition.value = *(short *)((long)local_78.data + 0xc) == 3;
    if (_kjCondition.value) {
      return (InterfaceSchema)(Schema)this->raw;
    }
  }
  local_28 = (WirePointer *)this->raw->generic->encodedNode;
  local_38 = (ArrayPtr<const_char>)ZEXT816(0);
  local_20 = 0x7fffffff;
  capnp::_::PointerReader::getStruct(&local_78,(PointerReader *)&local_38,(word *)0x0);
  local_28 = (WirePointer *)0x0;
  local_20 = 0x7fffffff;
  if (local_78.pointerCount != 0) {
    local_28 = local_78.pointers;
    local_20 = local_78.nestingLimit;
  }
  local_38.ptr._0_4_ = 0;
  local_38.ptr._4_4_ = 0;
  local_38.size_._0_4_ = 0;
  local_38.size_._4_4_ = 0;
  if (local_78.pointerCount != 0) {
    local_38.ptr._0_4_ = local_78.segment._0_4_;
    local_38.ptr._4_4_ = local_78.segment._4_4_;
    local_38.size_._0_4_ = local_78.capTable._0_4_;
    local_38.size_._4_4_ = local_78.capTable._4_4_;
  }
  local_38 = (ArrayPtr<const_char>)
             capnp::_::PointerReader::getBlob<capnp::Text>((PointerReader *)&local_38,(void *)0x0,0)
  ;
  kj::_::Debug::Fault::
  Fault<kj::Exception::Type,kj::_::DebugExpression<bool>&,char_const(&)[51],capnp::Text::Reader>
            (&f,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/schema.c++"
             ,299,FAILED,"getProto().isInterface()",
             "_kjCondition,\"Tried to use non-interface schema as an interface.\", getProto().getDisplayName()"
             ,&_kjCondition,(char (*) [51])"Tried to use non-interface schema as an interface.",
             (Reader *)&local_38);
  kj::_::Debug::Fault::~Fault(&f);
  return (InterfaceSchema)((long)capnp::_::NULL_INTERFACE_SCHEMA + 0x48);
}

Assistant:

InterfaceSchema Schema::asInterface() const {
  KJ_REQUIRE(getProto().isInterface(), "Tried to use non-interface schema as an interface.",
             getProto().getDisplayName()) {
    return InterfaceSchema();
  }
  return InterfaceSchema(*this);
}